

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool __thiscall
DynamicProfileStorageReaderWriter::WriteUtf8String
          (DynamicProfileStorageReaderWriter *this,char16 *str)

{
  bool bVar1;
  uint32 uVar2;
  size_t sVar3;
  Memory *this_00;
  bool local_89;
  uint local_74;
  bool success;
  code *pcStack_70;
  DWORD cbNeeded;
  undefined8 local_68;
  TrackAllocData local_60;
  uchar *local_38;
  utf8char_t *tempBuffer;
  size_t cbTempBuffer;
  char16 *pcStack_20;
  charcount_t len;
  char16 *str_local;
  DynamicProfileStorageReaderWriter *this_local;
  
  pcStack_20 = str;
  str_local = (char16 *)this;
  sVar3 = PAL_wcslen(str);
  cbTempBuffer._4_4_ = (uint32)sVar3;
  uVar2 = UInt32Math::Mul<3u>(cbTempBuffer._4_4_);
  tempBuffer = (utf8char_t *)(ulong)uVar2;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&unsigned_char::typeinfo,0,(size_t)tempBuffer,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
             ,0xa5);
  this_00 = (Memory *)
            Memory::NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_60);
  pcStack_70 = Memory::NoCheckHeapAllocator::Alloc;
  local_68 = 0;
  local_38 = Memory::AllocateArray<Memory::NoCheckHeapAllocator,unsigned_char,false>
                       (this_00,(NoCheckHeapAllocator *)Memory::NoCheckHeapAllocator::Alloc,0,
                        (size_t)tempBuffer);
  if (local_38 == (uchar *)0x0) {
    Output::Print(L"ERROR: DynamicProfileStorage: Out of memory writing to file \'%s\'\n",
                  this->filename);
    Output::Flush();
    this_local._7_1_ = false;
  }
  else {
    sVar3 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>
                      (local_38,(size_t)tempBuffer,pcStack_20,cbTempBuffer._4_4_);
    local_74 = (uint)sVar3;
    bVar1 = Write<unsigned_int>(this,&local_74);
    local_89 = false;
    if (bVar1) {
      local_89 = WriteArray<unsigned_char>(this,local_38,(ulong)local_74);
    }
    Memory::DeleteArray<Memory::NoCheckHeapAllocator,unsigned_char>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,(size_t)tempBuffer,local_38)
    ;
    this_local._7_1_ = local_89;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicProfileStorageReaderWriter::WriteUtf8String(char16 const * str)
{
    charcount_t len = static_cast<charcount_t>(wcslen(str));
    const size_t cbTempBuffer = UInt32Math::Mul<3>(len);
    utf8char_t * tempBuffer = NoCheckHeapNewArray(utf8char_t, cbTempBuffer);
    if (tempBuffer == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory writing to file '%s'\n"), filename);
        Output::Flush();
        return false;
    }
    DWORD cbNeeded = (DWORD)utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(tempBuffer, cbTempBuffer, str, len);
    bool success = Write(cbNeeded) && WriteArray(tempBuffer, cbNeeded);
    NoCheckHeapDeleteArray(cbTempBuffer, tempBuffer);
    return success;
}